

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O3

pair<long,_long> sinStrokeFunction(Coord x)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  pair<long,_long> pVar5;
  
  fVar4 = sinf(((float)(x + -0xc) / 30.0) * 6.283184);
  lVar1 = lroundf(fVar4 * 10.0);
  fVar4 = sinf(((float)(x + -0xb) / 30.0) * 6.283184);
  lVar2 = lroundf(fVar4 * 10.0);
  lVar3 = 0x3b - lVar1;
  if (lVar2 != lVar1) {
    lVar3 = 0x3a - lVar2;
  }
  pVar5.second = lVar3;
  pVar5.first = 0x3a - lVar1;
  return pVar5;
}

Assistant:

std::pair<Coord,Coord> sinStrokeFunction(Coord x) {
    // To understand the apparently random numbers below (58, 10, 12 and 11),
    // see line 115
    Coord base = 58 - std::lround(10*std::sin(2*3.141592f*((x - 12)/30.0f)));
    Coord end  = 58 - std::lround(10*std::sin(2*3.141592f*((x - 11)/30.0f)));
    // When drawing a horizontal segment, base equals end and
    // stroke would have 0 width: so we make it 1px wide
    return std::make_pair(base, (base != end) ? end : base + 1);
}